

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

string * __thiscall CodeGen::generateRecordType_abi_cxx11_(CodeGen *this,NodePtr *n)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  type pNVar4;
  undefined4 extraout_var;
  pointer ppVar5;
  ostream *poVar6;
  undefined4 extraout_var_00;
  reference pvVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  shared_ptr<avro::Node> *in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  string decoratedName;
  const_iterator it;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  types;
  size_t c;
  value_type *in_stack_fffffffffffffe08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  Name *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  NodePtr *in_stack_fffffffffffffe70;
  CodeGen *in_stack_fffffffffffffe78;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  string local_b8 [36];
  undefined4 local_94;
  iterator local_90;
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78 [3];
  string local_60 [32];
  ulong local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  ulong local_20;
  shared_ptr<avro::Node> *local_18;
  
  local_18 = in_RDX;
  pNVar4 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  iVar2 = (*pNVar4->_vptr_Node[4])();
  local_20 = CONCAT44(extraout_var,iVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b999d);
  for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar4->_vptr_Node[5])(pNVar4,local_40 & 0xffffffff);
    generateType_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_60);
  }
  local_80._M_node =
       (_Base_ptr)
       std::
       map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffe08,(key_type *)0x1b9aa0);
  std::
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(local_78,&local_80);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe08);
  std::
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_88,&local_90);
  bVar1 = std::operator!=(local_78,&local_88);
  if (bVar1) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1b9b28);
    std::__cxx11::string::string((string *)in_RDI,(string *)&ppVar5->second);
    local_94 = 1;
  }
  else {
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar4->_vptr_Node[3])();
    decorate_abi_cxx11_(in_stack_fffffffffffffe18);
    poVar6 = std::operator<<(*(ostream **)(in_RSI + 8),"struct ");
    poVar6 = std::operator<<(poVar6,local_b8);
    std::operator<<(poVar6," {\n");
    if ((*(byte *)(in_RSI + 0x98) & 1) == 0) {
      for (local_c0 = 0; local_c0 < local_20; local_c0 = local_c0 + 1) {
        pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
        iVar2 = (*pNVar4->_vptr_Node[5])(pNVar4,local_c0 & 0xffffffff);
        pNVar4 = boost::shared_ptr<avro::Node>::operator->
                           ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_00,iVar2));
        TVar3 = avro::Node::type(pNVar4);
        if (TVar3 == AVRO_UNION) {
          poVar6 = std::operator<<(*(ostream **)(in_RSI + 8),"    typedef ");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_38,local_c0);
          poVar6 = std::operator<<(poVar6,(string *)pvVar7);
          poVar6 = std::operator<<(poVar6,' ');
          pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
          iVar2 = (*pNVar4->_vptr_Node[8])(pNVar4,local_c0 & 0xffffffff);
          poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar2));
          std::operator<<(poVar6,"_t;\n");
        }
      }
    }
    for (local_c8 = 0; local_c8 < local_20; local_c8 = local_c8 + 1) {
      if ((*(byte *)(in_RSI + 0x98) & 1) == 0) {
        pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
        iVar2 = (*pNVar4->_vptr_Node[5])(pNVar4,local_c8 & 0xffffffff);
        pNVar4 = boost::shared_ptr<avro::Node>::operator->
                           ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_02,iVar2));
        TVar3 = avro::Node::type(pNVar4);
        if (TVar3 != AVRO_UNION) goto LAB_001b9e91;
        poVar6 = std::operator<<(*(ostream **)(in_RSI + 8),"    ");
        pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
        iVar2 = (*pNVar4->_vptr_Node[8])(pNVar4,local_c8 & 0xffffffff);
        poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_03,iVar2));
        std::operator<<(poVar6,"_t");
      }
      else {
LAB_001b9e91:
        poVar6 = std::operator<<(*(ostream **)(in_RSI + 8),"    ");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_38,local_c8);
        std::operator<<(poVar6,(string *)pvVar7);
      }
      poVar6 = std::operator<<(*(ostream **)(in_RSI + 8),' ');
      pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
      iVar2 = (*pNVar4->_vptr_Node[8])(pNVar4,local_c8 & 0xffffffff);
      poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_04,iVar2));
      std::operator<<(poVar6,";\n");
    }
    poVar6 = std::operator<<(*(ostream **)(in_RSI + 8),"    ");
    poVar6 = std::operator<<(poVar6,local_b8);
    std::operator<<(poVar6,"()");
    if (local_20 != 0) {
      std::operator<<(*(ostream **)(in_RSI + 8)," :");
    }
    std::operator<<(*(ostream **)(in_RSI + 8),"\n");
    for (local_d0 = 0; local_d0 < local_20; local_d0 = local_d0 + 1) {
      poVar6 = std::operator<<(*(ostream **)(in_RSI + 8),"        ");
      pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
      iVar2 = (*pNVar4->_vptr_Node[8])(pNVar4,local_d0 & 0xffffffff);
      poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_05,iVar2));
      std::operator<<(poVar6,"(");
      if ((*(byte *)(in_RSI + 0x98) & 1) == 0) {
        pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
        iVar2 = (*pNVar4->_vptr_Node[5])(pNVar4,local_d0 & 0xffffffff);
        pNVar4 = boost::shared_ptr<avro::Node>::operator->
                           ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_06,iVar2));
        TVar3 = avro::Node::type(pNVar4);
        if (TVar3 != AVRO_UNION) goto LAB_001ba141;
        poVar6 = *(ostream **)(in_RSI + 8);
        pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
        iVar2 = (*pNVar4->_vptr_Node[8])(pNVar4,local_d0 & 0xffffffff);
        in_stack_fffffffffffffe20 =
             std::operator<<(poVar6,(string *)CONCAT44(extraout_var_07,iVar2));
        std::operator<<(in_stack_fffffffffffffe20,"_t");
      }
      else {
LAB_001ba141:
        in_stack_fffffffffffffe18 = *(Name **)(in_RSI + 8);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_38,local_d0);
        std::operator<<((ostream *)in_stack_fffffffffffffe18,(string *)pvVar7);
      }
      std::operator<<(*(ostream **)(in_RSI + 8),"())");
      if (local_d0 != local_20 - 1) {
        std::operator<<(*(ostream **)(in_RSI + 8),',');
      }
      std::operator<<(*(ostream **)(in_RSI + 8),"\n");
    }
    std::operator<<(*(ostream **)(in_RSI + 8),"        { }\n");
    std::operator<<(*(ostream **)(in_RSI + 8),"};\n\n");
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar4->_vptr_Node[3])();
    decorate_abi_cxx11_(in_stack_fffffffffffffe18);
    local_94 = 1;
    std::__cxx11::string::~string(local_b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe20);
  return in_RDI;
}

Assistant:

string CodeGen::generateRecordType(const NodePtr& n)
{
    size_t c = n->leaves();
    vector<string> types;
    for (size_t i = 0; i < c; ++i) {
        types.push_back(generateType(n->leafAt(i)));
    }

    map<NodePtr, string>::const_iterator it = done.find(n);
    if (it != done.end()) {
        return it->second;
    }

    string decoratedName = decorate(n->name());
    os_ << "struct " << decoratedName << " {\n";
    if (! noUnion_) {
        for (size_t i = 0; i < c; ++i) {
            if (n->leafAt(i)->type() == avro::AVRO_UNION) {
                os_ << "    typedef " << types[i]
                    << ' ' << n->nameAt(i) << "_t;\n";
            }
        }
    }
    for (size_t i = 0; i < c; ++i) {
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << "    " << n->nameAt(i) << "_t";
        } else {
            os_ << "    " << types[i];
        }
        os_ << ' ' << n->nameAt(i) << ";\n";
    }

    os_ << "    " << decoratedName << "()";
    if (c > 0) {
        os_ << " :";
    }
    os_ << "\n";
    for (size_t i = 0; i < c; ++i) {
        os_ << "        " << n->nameAt(i) << "(";
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << n->nameAt(i) << "_t";
        } else {
            os_ << types[i];
        }
        os_ << "())";
        if (i != (c - 1)) {
            os_ << ',';
        }
        os_ << "\n";
    }
    os_ << "        { }\n";
    os_ << "};\n\n";
    return decorate(n->name());
}